

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void ge_msub(ge_p1p1 *r,ge_p3 *p,ge_precomp *q)

{
  undefined1 local_98 [8];
  fe trT;
  fe trZ;
  fe trY;
  ge_precomp *q_local;
  ge_p3 *p_local;
  ge_p1p1 *r_local;
  
  fe_add(&r->X,&p->Y,&p->X);
  fe_sub(&r->Y,&p->Y,&p->X);
  fe_mul_tll((fe *)(trT.v + 4),&r->X,&q->yminusx);
  fe_mul_tll((fe *)(trZ.v + 4),&r->Y,&q->yplusx);
  fe_mul_tlt((fe *)local_98,&q->xy2d,&p->T);
  fe_add(&r->T,&p->Z,&p->Z);
  fe_sub(&r->X,(fe *)(trT.v + 4),(fe *)(trZ.v + 4));
  fe_add(&r->Y,(fe *)(trT.v + 4),(fe *)(trZ.v + 4));
  fe_carry((fe *)(trT.v + 4),&r->T);
  fe_sub(&r->Z,(fe *)(trT.v + 4),(fe *)local_98);
  fe_add(&r->T,(fe *)(trT.v + 4),(fe *)local_98);
  return;
}

Assistant:

static void ge_msub(ge_p1p1 *r, const ge_p3 *p, const ge_precomp *q) {
  fe trY, trZ, trT;

  fe_add(&r->X, &p->Y, &p->X);
  fe_sub(&r->Y, &p->Y, &p->X);
  fe_mul_tll(&trZ, &r->X, &q->yminusx);
  fe_mul_tll(&trY, &r->Y, &q->yplusx);
  fe_mul_tlt(&trT, &q->xy2d, &p->T);
  fe_add(&r->T, &p->Z, &p->Z);
  fe_sub(&r->X, &trZ, &trY);
  fe_add(&r->Y, &trZ, &trY);
  fe_carry(&trZ, &r->T);
  fe_sub(&r->Z, &trZ, &trT);
  fe_add(&r->T, &trZ, &trT);
}